

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_chacha20_hw.c
# Opt level: O0

int chacha20_initkey(PROV_CIPHER_CTX *bctx,uint8_t *key,size_t keylen)

{
  uint i;
  PROV_CHACHA20_CTX *ctx;
  size_t keylen_local;
  uint8_t *key_local;
  PROV_CIPHER_CTX *bctx_local;
  
  if (key != (uint8_t *)0x0) {
    for (i = 0; i < 0x20; i = i + 4) {
      *(uint *)(bctx[1].oiv + (ulong)(i >> 2) * 4 + -0x74) =
           CONCAT13(key[(ulong)i + 3],CONCAT12(key[(ulong)i + 2],CONCAT11(key[(ulong)i + 1],key[i]))
                   );
    }
  }
  bctx[1].num = 0;
  return 1;
}

Assistant:

static int chacha20_initkey(PROV_CIPHER_CTX *bctx, const uint8_t *key,
                            size_t keylen)
{
    PROV_CHACHA20_CTX *ctx = (PROV_CHACHA20_CTX *)bctx;
    unsigned int i;

    if (key != NULL) {
        for (i = 0; i < CHACHA_KEY_SIZE; i += 4)
            ctx->key.d[i / 4] = CHACHA_U8TOU32(key + i);
    }
    ctx->partial_len = 0;
    return 1;
}